

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

void xmlBufferFree(xmlBufferPtr buf)

{
  xmlBufferPtr pxVar1;
  
  if (buf != (xmlBufferPtr)0x0) {
    pxVar1 = (xmlBufferPtr)&buf->contentIO;
    if (buf->alloc != XML_BUFFER_ALLOC_IO) {
      pxVar1 = buf;
    }
    (*xmlFree)(pxVar1->content);
    (*xmlFree)(buf);
    return;
  }
  return;
}

Assistant:

void
xmlBufferFree(xmlBufferPtr buf) {
    if (buf == NULL)
	return;

    if (buf->alloc == XML_BUFFER_ALLOC_IO)
        xmlFree(buf->contentIO);
    else
        xmlFree(buf->content);

    xmlFree(buf);
}